

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  anon_struct_4_9_b482b7ef_for_fg *data;
  char cVar1;
  uint uVar2;
  sqlite3 *db;
  void *p;
  bool bVar3;
  Column **ppCVar4;
  u8 uVar5;
  ushort uVar6;
  uint uVar7;
  u32 uVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar9;
  Column *pCVar10;
  char *pcVar11;
  long *plVar12;
  byte *pKey;
  HashElem *pHVar13;
  size_t sVar14;
  ulong uVar15;
  undefined1 *puVar16;
  byte *pbVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  char *zIn;
  Column *p_00;
  int *piVar21;
  i16 *piVar22;
  long lVar23;
  u32 cnt;
  Hash ht;
  uint local_84;
  int *local_80;
  ExprList *local_78;
  uint local_6c;
  i16 *local_68;
  Column **local_60;
  ulong local_58;
  Column *local_50;
  Hash local_48;
  
  db = pParse->db;
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  local_60 = paCol;
  if (pEList == (ExprList *)0x0) {
    *pnCol = 0;
    *paCol = (Column *)0x0;
    uVar20 = 0;
    p_00 = (Column *)0x0;
    piVar21 = &pParse->nErr;
    piVar22 = pnCol;
  }
  else {
    uVar2 = pEList->nExpr;
    local_78 = pEList;
    pCVar10 = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar2 << 4);
    uVar7 = 0x7fff;
    if ((int)uVar2 < 0x7fff) {
      uVar7 = uVar2;
    }
    local_80 = &pParse->nErr;
    *pnCol = (i16)uVar7;
    *paCol = pCVar10;
    if ((long)(int)uVar2 < 1) {
      uVar20 = 0;
      p_00 = pCVar10;
      piVar21 = local_80;
      piVar22 = pnCol;
    }
    else {
      local_78 = (ExprList *)local_78->a;
      local_58 = (ulong)uVar7;
      uVar20 = 0;
      local_6c = uVar7;
      local_68 = pnCol;
      local_50 = pCVar10;
      do {
        p_00 = local_50;
        piVar21 = local_80;
        piVar22 = local_68;
        if (*local_80 != 0) goto LAB_0017883a;
        data = &local_78->a[uVar20 - 1].fg;
        zIn = *(char **)(data + 2);
        if ((zIn == (char *)0x0) || ((*(byte *)((long)(data + 4) + 1) & 3) != 0)) {
          for (pcVar11 = *(char **)data; (*(uint *)(pcVar11 + 4) & 0x82000) != 0;
              pcVar11 = *(char **)pcVar11) {
            if ((*(uint *)(pcVar11 + 4) >> 0x13 & 1) == 0) {
              if (*pcVar11 != 'q') break;
              pcVar11 = pcVar11 + 0x10;
            }
            else {
              pcVar11 = (char *)(*(long *)(pcVar11 + 0x20) + 8);
            }
          }
          for (; cVar1 = *pcVar11, cVar1 == -0x73; pcVar11 = *(char **)(pcVar11 + 0x18)) {
          }
          if (cVar1 == ';') {
            plVar12 = (long *)(pcVar11 + 8);
LAB_00178676:
            zIn = (char *)*plVar12;
          }
          else if (((cVar1 == -0x59) && ((pcVar11[7] & 3U) == 0)) &&
                  (lVar23 = *(long *)(pcVar11 + 0x40), lVar23 != 0)) {
            uVar6 = *(ushort *)(pcVar11 + 0x30);
            if ((short)uVar6 < 0) {
              uVar6 = *(ushort *)(lVar23 + 0x34);
              zIn = "rowid";
              if ((short)uVar6 < 0) goto LAB_0017867e;
            }
            plVar12 = (long *)((ulong)uVar6 * 0x10 + *(long *)(lVar23 + 8));
            goto LAB_00178676;
          }
          if (zIn != (char *)0x0) goto LAB_0017867e;
LAB_0017868a:
          pKey = (byte *)sqlite3MPrintf(db,"column%d",(ulong)((int)uVar20 + 1));
        }
        else {
LAB_0017867e:
          uVar8 = sqlite3IsTrueOrFalse(zIn);
          if (uVar8 != 0) goto LAB_0017868a;
          pKey = (byte *)sqlite3DbStrDup(db,zIn);
        }
        local_84 = 0;
LAB_001786b6:
        if (pKey == (byte *)0x0) {
          pCVar10->zCnName = (char *)0x0;
          bVar3 = true;
          pKey = (byte *)0x0;
        }
        else {
          pHVar13 = findElementWithHash(&local_48,(char *)pKey,(uint *)0x0);
          if (pHVar13->data != (void *)0x0) goto code_r0x001786db;
          pCVar10->zCnName = (char *)pKey;
          bVar18 = *pKey;
          if (bVar18 != 0) {
            uVar5 = '\0';
            pbVar17 = pKey;
            do {
              pbVar17 = pbVar17 + 1;
              uVar5 = uVar5 + ""[bVar18];
              bVar18 = *pbVar17;
            } while (bVar18 != 0);
            bVar3 = false;
            goto LAB_00178780;
          }
          bVar3 = false;
        }
        uVar5 = '\0';
LAB_00178780:
        pCVar10->hName = uVar5;
        if ((*(byte *)((long)(data + 4) + 2) & 1) != 0) {
          pbVar17 = (byte *)((long)&pCVar10->colFlags + 1);
          *pbVar17 = *pbVar17 | 4;
        }
        if ((!bVar3) &&
           (puVar16 = (undefined1 *)sqlite3HashInsert(&local_48,(char *)pKey,data),
           (anon_struct_4_9_b482b7ef_for_fg *)puVar16 == data)) {
          sqlite3OomFault(db);
        }
        uVar20 = uVar20 + 1;
        pCVar10 = pCVar10 + 1;
      } while (uVar20 != local_58);
      uVar20 = (ulong)local_6c;
      p_00 = local_50;
      piVar21 = local_80;
      piVar22 = local_68;
    }
  }
LAB_0017883a:
  sqlite3HashClear(&local_48);
  ppCVar4 = local_60;
  if (*piVar21 == 0) {
    return extraout_EAX;
  }
  if ((int)uVar20 == 0) {
    iVar9 = extraout_EAX;
    if (p_00 == (Column *)0x0) goto LAB_00178892;
  }
  else {
    lVar23 = 0;
    do {
      p = *(void **)((long)&p_00->zCnName + lVar23);
      if (p != (void *)0x0) {
        sqlite3DbFreeNN(db,p);
      }
      lVar23 = lVar23 + 0x10;
    } while ((uVar20 & 0xffffffff) << 4 != lVar23);
  }
  sqlite3DbFreeNN(db,p_00);
  iVar9 = extraout_EAX_00;
LAB_00178892:
  *ppCVar4 = (Column *)0x0;
  *piVar22 = 0;
  return iVar9;
code_r0x001786db:
  if ((*(byte *)((long)pHVar13->data + 0x11) & 0x80) != 0) {
    pbVar17 = (byte *)((long)&pCVar10->colFlags + 1);
    *pbVar17 = *pbVar17 | 4;
  }
  sVar14 = strlen((char *)pKey);
  if ((sVar14 & 0x3fffffff) == 0) {
    uVar19 = 0;
  }
  else {
    uVar15 = (ulong)((uint)sVar14 & 0x3fffffff);
    do {
      if (uVar15 < 2) {
        bVar18 = *pKey;
        uVar15 = 0;
        break;
      }
      uVar15 = uVar15 - 1;
      bVar18 = pKey[uVar15 & 0xffffffff];
    } while (0xfffffffffffffff5 < (ulong)bVar18 - 0x3a);
    uVar19 = (ulong)((uint)sVar14 & 0x3fffffff);
    if (bVar18 == 0x3a) {
      uVar19 = uVar15 & 0xffffffff;
    }
  }
  local_84 = local_84 + 1;
  pKey = (byte *)sqlite3MPrintf(db,"%.*z:%u",uVar19);
  sqlite3ProgressCheck(pParse);
  if (3 < local_84) {
    sqlite3_randomness(4,&local_84);
  }
  goto LAB_001786b6;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */
  Table *pTab;

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( NEVER(nCol>32767) ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !pParse->nErr; i++, pCol++){
    struct ExprList_item *pX = &pEList->a[i];
    struct ExprList_item *pCollide;
    /* Get an appropriate name for the column
    */
    if( (zName = pX->zEName)!=0 && pX->fg.eEName==ENAME_NAME ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollateAndLikely(pX->pExpr);
      while( ALWAYS(pColExpr!=0) && pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN
       && ALWAYS( ExprUseYTab(pColExpr) )
       && ALWAYS( pColExpr->y.pTab!=0 )
      ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->y.pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zCnName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        assert( zName==pX->zEName );  /* pointer comparison intended */
      }
    }
    if( zName && !sqlite3IsTrueOrFalse(zName) ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && (pCollide = sqlite3HashFind(&ht, zName))!=0 ){
      if( pCollide->fg.bUsingTerm ){
        pCol->colFlags |= COLFLAG_NOEXPAND;
      }
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      sqlite3ProgressCheck(pParse);
      if( cnt>3 ){
        sqlite3_randomness(sizeof(cnt), &cnt);
      }
    }
    pCol->zCnName = zName;
    pCol->hName = sqlite3StrIHash(zName);
    if( pX->fg.bNoExpand ){
      pCol->colFlags |= COLFLAG_NOEXPAND;
    }
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pX)==pX ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( pParse->nErr ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zCnName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return pParse->rc;
  }
  return SQLITE_OK;
}